

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O1

bool __thiscall zsummer::log4z::CLog4zFile::Open(CLog4zFile *this,char *path,char *mod)

{
  FILE *pFVar1;
  
  if ((FILE *)this->m_file != (FILE *)0x0) {
    fclose((FILE *)this->m_file);
    this->m_file = (FILE *)0x0;
  }
  pFVar1 = fopen(path,mod);
  this->m_file = (FILE *)pFVar1;
  return pFVar1 != (FILE *)0x0;
}

Assistant:

bool Open(const char *path, const char * mod)
	{
		if (m_file != NULL)
		{
			fclose(m_file);
			m_file = NULL;
		}
		m_file = fopen(path, mod);
		if (m_file == NULL)
		{
			return false;
		}
		return true;
	}